

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreApp.cpp
# Opt level: O1

void __thiscall
helics::CoreApp::processArgs
          (CoreApp *this,
          unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *app)

{
  CoreType CVar1;
  helicsCLI11App *phVar2;
  pointer ppVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args;
  char *pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  HelicsException *this_01;
  pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *miss;
  pointer ppVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  pointer this_02;
  string_view coreName;
  string_view message;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  remArgs;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  phVar2 = (app->_M_t).
           super___uniq_ptr_impl<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::helicsCLI11App_*,_std::default_delete<helics::helicsCLI11App>_>
           .super__Head_base<0UL,_helics::helicsCLI11App_*,_false>._M_head_impl;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar7 = *(pointer *)
            &(phVar2->super_App).missing_.
             super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl;
  ppVar3 = *(pointer *)((long)&(phVar2->super_App).missing_ + 8);
  if (ppVar7 != ppVar3) {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_68,(value_type *)&ppVar7->second);
      ppVar7 = ppVar7 + 1;
    } while (ppVar7 != ppVar3);
  }
  __s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        (local_68.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1);
  this_02 = local_68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start < __s &&
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,__s);
      this_02 = (pointer)((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          this_02 + 1);
      __s = __s + -1;
    } while (this_02 < __s);
  }
  CVar1 = ((app->_M_t).
           super___uniq_ptr_impl<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::helicsCLI11App_*,_std::default_delete<helics::helicsCLI11App>_>
           .super__Head_base<0UL,_helics::helicsCLI11App_*,_false>._M_head_impl)->coreType;
  args = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(this->name)._M_dataplus._M_p;
  pcVar4 = (char *)(this->name)._M_string_length;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,&local_68);
  coreName._M_len = (ulong)CVar1;
  coreName._M_str = pcVar4;
  CoreFactory::create((CoreType)&local_78,coreName,args);
  p_Var6 = p_Stack_70;
  peVar5 = local_78;
  local_78 = (element_type *)0x0;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  (this->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var6;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if ((this->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    return;
  }
  this_01 = (HelicsException *)__cxa_allocate_exception(0x28);
  message._M_str = "Unable to create core\n";
  message._M_len = 0x16;
  HelicsException::HelicsException(this_01,message);
  *(undefined ***)this_01 = &PTR__HelicsException_00559cc0;
  __cxa_throw(this_01,&ConnectionFailure::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void CoreApp::processArgs(std::unique_ptr<helicsCLI11App>& app)
{
    auto remArgs = app->remaining_for_passthrough();
    try {
        core = CoreFactory::create(app->getCoreType(), name, remArgs);
    }
    catch (...) {
        if (!remArgs.empty()) {
            name = remArgs.front();
        }
        if (!name.empty()) {
            core = CoreFactory::findCore(name);
            if (core) {
                // LCOV_EXCL_START
                name = core->getIdentifier();
                return;
                // LCOV_EXCL_STOP
            }
        }
    }
    if (!core) {
        throw(ConnectionFailure("Unable to create core\n"));
    }
}